

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.h
# Opt level: O2

ostream * __thiscall
dynamicgraph::
SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
::displayDependencies
          (SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,ostream *os,int depth,string *space,string *next1,string *next2)

{
  ostream *poVar1;
  string sStack_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)space);
  std::__cxx11::string::string((string *)&local_68,(string *)next1);
  std::__cxx11::string::string((string *)&sStack_88,(string *)next2);
  poVar1 = TimeDependency<int>::displayDependencies
                     (&this->super_TimeDependency<int>,os,depth,&local_48,&local_68,&sStack_88);
  std::__cxx11::string::~string((string *)&sStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return poVar1;
}

Assistant:

std::ostream &displayDependencies(std::ostream &os, const int depth = -1,
                                    std::string space = "",
                                    std::string next1 = "",
                                    std::string next2 = "") const {
    return TimeDependency<Time>::displayDependencies(os, depth, space, next1,
                                                     next2);
  }